

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteStates.cpp
# Opt level: O0

Index __thiscall MADPComponentDiscreteStates::SampleInitialState(MADPComponentDiscreteStates *this)

{
  int iVar1;
  ostream *poVar2;
  undefined8 uVar3;
  vector<double,_std::allocator<double>_> *pvVar4;
  reference pvVar5;
  vector<double,_std::allocator<double>_> *this_00;
  long in_RDI;
  Index i;
  Index state;
  double sum;
  double randNr;
  stringstream ss;
  stringstream *in_stack_fffffffffffffe18;
  E *in_stack_fffffffffffffe20;
  uint local_1b8;
  double local_1b0;
  stringstream local_190 [16];
  ostream local_180 [384];
  
  if ((*(byte *)(in_RDI + 8) & 1) == 0) {
    std::__cxx11::stringstream::stringstream(local_190);
    poVar2 = std::operator<<(local_180,"MADPComponentDiscreteStates::SampleInitialState()");
    poVar2 = std::operator<<(poVar2," - Error: not initialized. ");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    uVar3 = __cxa_allocate_exception(0x28);
    E::E(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    __cxa_throw(uVar3,&E::typeinfo,E::~E);
  }
  iVar1 = rand();
  local_1b0 = 0.0;
  local_1b8 = 0;
  while( true ) {
    this_00 = (vector<double,_std::allocator<double>_> *)(ulong)local_1b8;
    pvVar4 = (vector<double,_std::allocator<double>_> *)
             std::vector<double,_std::allocator<double>_>::size
                       ((vector<double,_std::allocator<double>_> *)(*(long *)(in_RDI + 0x30) + 8));
    if (pvVar4 <= this_00) {
      return 0;
    }
    pvVar5 = std::vector<double,_std::allocator<double>_>::at
                       (this_00,(size_type)in_stack_fffffffffffffe18);
    local_1b0 = *pvVar5 + local_1b0;
    if ((double)iVar1 / 2147483648.0 <= local_1b0) break;
    local_1b8 = local_1b8 + 1;
  }
  return local_1b8;
}

Assistant:

Index MADPComponentDiscreteStates::SampleInitialState() const
{
  if(!_m_initialized)
  {
    stringstream ss;
    ss << "MADPComponentDiscreteStates::SampleInitialState()" <<
      " - Error: not initialized. " << endl;
    throw E(ss);
  }
  
  double randNr=rand() / (RAND_MAX + 1.0);

  double sum=0;
  Index state=0,i;
  for(i=0;i<_m_initialStateDistribution->size();i++)
  {
    sum+= _m_initialStateDistribution->at(i);
    if(randNr<=sum)
    {
      state=i;
      break;
    }
  }

  return(state);
}